

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop.c
# Opt level: O3

void us_internal_loop_data_init
               (us_loop_t *loop,_func_void_us_loop_t_ptr *wakeup_cb,_func_void_us_loop_t_ptr *pre_cb
               ,_func_void_us_loop_t_ptr *post_cb)

{
  us_timer_t *puVar1;
  char *pcVar2;
  us_internal_async *a;
  
  puVar1 = us_create_timer(loop,1,0);
  (loop->data).sweep_timer = puVar1;
  pcVar2 = (char *)malloc(0x80040);
  (loop->data).recv_buf = pcVar2;
  (loop->data).ssl_data = (void *)0x0;
  (loop->data).closed_head = (us_socket_t *)0x0;
  (loop->data).iteration_nr = 0;
  (loop->data).head = (us_socket_context_t *)0x0;
  (loop->data).iterator = (us_socket_context_t *)0x0;
  (loop->data).pre_cb = pre_cb;
  (loop->data).post_cb = post_cb;
  a = us_internal_create_async(loop,1,0);
  (loop->data).wakeup_async = a;
  us_internal_async_set(a,(_func_void_us_internal_async_ptr *)wakeup_cb);
  return;
}

Assistant:

void us_internal_loop_data_init(struct us_loop_t *loop, void (*wakeup_cb)(struct us_loop_t *loop),
    void (*pre_cb)(struct us_loop_t *loop), void (*post_cb)(struct us_loop_t *loop)) {
    loop->data.sweep_timer = us_create_timer(loop, 1, 0);
    loop->data.recv_buf = malloc(LIBUS_RECV_BUFFER_LENGTH + LIBUS_RECV_BUFFER_PADDING * 2);
    loop->data.ssl_data = 0;
    loop->data.head = 0;
    loop->data.iterator = 0;
    loop->data.closed_head = 0;

    loop->data.pre_cb = pre_cb;
    loop->data.post_cb = post_cb;
    loop->data.iteration_nr = 0;

    loop->data.wakeup_async = us_internal_create_async(loop, 1, 0);
    us_internal_async_set(loop->data.wakeup_async, (void (*)(struct us_internal_async *)) wakeup_cb);
}